

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::SignalPtr<double,_int>::plug
          (SignalPtr<double,_int> *this,SignalBase<int> *unknown_ref)

{
  Signal<double,_int> *local_78;
  double *t;
  Signal<double,_int> *ref;
  SignalBase<int> *unknown_ref_local;
  SignalPtr<double,_int> *this_local;
  
  if (unknown_ref == (SignalBase<int> *)0x0) {
    this->signalPtr = (Signal<double,_int> *)0x0;
    this->transmitAbstract = false;
  }
  else {
    if (unknown_ref == (SignalBase<int> *)0x0) {
      local_78 = (Signal<double,_int> *)0x0;
    }
    else {
      local_78 = (Signal<double,_int> *)
                 __dynamic_cast(unknown_ref,&SignalBase<int>::typeinfo,&Signal<double,int>::typeinfo
                                ,0);
    }
    if (local_78 == (Signal<double,_int> *)0x0) {
      (*unknown_ref->_vptr_SignalBase[0x17])();
    }
    else {
      this->transmitAbstract = false;
      this->signalPtr = local_78;
    }
  }
  return;
}

Assistant:

void SignalPtr<T, Time>::plug(SignalBase<Time> *unknown_ref) {
  dgTDEBUGIN(5);
  if (!unknown_ref) {
    signalPtr = NULL;
    transmitAbstract = false;
    dgTDEBUGOUT(5);
    return;
  }

  dgTDEBUG(5) << "# In  T = " << getName() << " ="
              << typeid(Signal<T, Time>::Tcopy1).name() << "{ " << std::endl;

  Signal<T, Time> *ref = dynamic_cast<Signal<T, Time> *>(unknown_ref);
  if (NULL == ref) {
    try {
      unknown_ref->checkCompatibility();
    } catch (T *t) {
      dgTDEBUG(25) << "Cast THROW ok." << std::endl;
      Signal<T, Time>::setReference(t);
      transmitAbstract = true;
      abstractTransmitter = unknown_ref;
      transmitAbstractData = t;
    } catch (...) {
      dgTDEBUG(25) << "Fatal error." << std::endl;
      transmitAbstract = false;
      DG_THROW ExceptionSignal(ExceptionSignal::PLUG_IMPOSSIBLE,
                               "Compl. Uncompatible types for plugin.",
                               "(while trying to plug <%s> on <%s>)"
                               " with types <%s> on <%s>.",
                               unknown_ref->getName().c_str(),
                               this->getName().c_str(), typeid(T).name(),
                               typeid(unknown_ref).name());
    }
  } else {
    dgTDEBUG(25) << "Cast ok." << std::endl;
    transmitAbstract = false;
    signalPtr = ref;
  }
  dgTDEBUGOUT(5);
}